

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall
QDockWidgetPrivate::nonClientAreaMouseEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  Type TVar5;
  Int IVar6;
  QWidget *this_00;
  QStyle *pQVar7;
  QWidget *this_01;
  QRect *pQVar8;
  QMainWindow *pQVar9;
  QDockWidgetGroupWindow *pQVar10;
  ulong uVar11;
  QDockWidgetPrivate *in_RSI;
  QDockWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *tl;
  int fw;
  QDockWidget *q;
  QRect titleRect;
  QRect geo;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  QDockWidgetPrivate *pQVar12;
  undefined1 nca;
  undefined4 in_stack_ffffffffffffff80;
  DragScope scope;
  EndDragMode mode;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QPoint local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = in_RDI;
  this_00 = &q_func(in_RDI)->super_QWidget;
  mode = (EndDragMode)((ulong)pQVar12 >> 0x20);
  pQVar7 = QWidget::style((QWidget *)
                          CONCAT17(in_stack_ffffffffffffff4f,
                                   CONCAT16(in_stack_ffffffffffffff4e,
                                            CONCAT24(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48))));
  uVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x12,0,this_00);
  this_01 = QWidget::topLevelWidget((QWidget *)0x58e661);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = QWidget::geometry(this_01);
  local_18._0_8_ = *(undefined8 *)pQVar8;
  local_18._8_4_ = pQVar8->x2;
  local_18._12_4_ = pQVar8->y2;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (undefined1  [16])QWidget::frameGeometry(this_00);
  scope = (DragScope)((ulong)this_00 >> 0x20);
  pQVar12 = (QDockWidgetPrivate *)local_18;
  QRect::left((QRect *)0x58e6c5);
  pQVar8 = (QRect *)local_28;
  QRect::setLeft((QRect *)in_RDI,
                 CONCAT13(in_stack_ffffffffffffff4f,
                          CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
  QRect::right((QRect *)0x58e6e3);
  QRect::setRight((QRect *)in_RDI,
                  CONCAT13(in_stack_ffffffffffffff4f,
                           CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
  QRect::top((QRect *)0x58e6f9);
  QRect::setBottom((QRect *)in_RDI,
                   CONCAT13(in_stack_ffffffffffffff4f,
                            CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
  QRect::adjust(pQVar8,(int)((ulong)pQVar12 >> 0x20),(int)pQVar12,(int)((ulong)in_RDI >> 0x20),
                (int)in_RDI);
  TVar5 = QEvent::type((QEvent *)in_RSI);
  uVar11 = (ulong)(TVar5 - NonClientAreaMouseMove);
  switch(uVar11) {
  case 0:
    if (((in_RDI->state != (DragState *)0x0) && ((in_RDI->state->dragging & 1U) != 0)) &&
       ((in_RDI->state->nca & 1U) != 0)) {
      endDrag((QDockWidgetPrivate *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              mode);
    }
    break;
  case 1:
    QSinglePointEvent::globalPosition((QSinglePointEvent *)0x58e75f);
    nca = (undefined1)(uVar11 >> 0x38);
    local_30 = QPointF::toPoint((QPointF *)pQVar8);
    bVar1 = QRect::contains((QPoint *)local_28,SUB81(&local_30,0));
    if ((((((bVar1 ^ 0xff) & 1) == 0) && (in_RDI->state == (DragState *)0x0)) &&
        ((pQVar9 = qobject_cast<QMainWindow*>((QObject *)0x58e7c6), pQVar9 != (QMainWindow *)0x0 ||
         (pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58e7da),
         pQVar10 != (QDockWidgetGroupWindow *)0x0)))) && (bVar2 = isAnimating(pQVar12), !bVar2)) {
      QSinglePointEvent::position((QSinglePointEvent *)0x58e804);
      QPointF::toPoint((QPointF *)pQVar8);
      initDrag((QDockWidgetPrivate *)CONCAT44(uVar4,in_stack_ffffffffffffff80),(QPoint *)this_01,
               (bool)nca);
      if (in_RDI->state != (DragState *)0x0) {
        QInputEvent::modifiers((QInputEvent *)in_RDI);
        QFlags<Qt::KeyboardModifier>::operator&
                  ((QFlags<Qt::KeyboardModifier> *)in_RDI,
                   CONCAT13(in_stack_ffffffffffffff4f,
                            CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
        IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffa4);
        bVar2 = true;
        if (IVar6 == 0) {
          bVar3 = hasFeature(in_RDI,CONCAT13(1,CONCAT12(in_stack_ffffffffffffff4e,
                                                        in_stack_ffffffffffffff4c)));
          bVar2 = false;
          if (!bVar3) {
            bVar2 = QDockWidget::isFloating((QDockWidget *)0x58e8a5);
          }
        }
        in_RDI->state->ctrlDrag = bVar2;
        startDrag(in_RSI,scope);
      }
    }
    break;
  case 2:
    break;
  case 3:
    toggleTopLevel(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetPrivate::nonClientAreaMouseEvent(QMouseEvent *event)
{
    Q_Q(QDockWidget);

    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    QWidget *tl = q->topLevelWidget();
    QRect geo = tl->geometry();
    QRect titleRect = tl->frameGeometry();
    {
        titleRect.setLeft(geo.left());
        titleRect.setRight(geo.right());
        titleRect.setBottom(geo.top() - 1);
        titleRect.adjust(0, fw, 0, 0);
    }

    switch (event->type()) {
        case QEvent::NonClientAreaMouseButtonPress:
            if (!titleRect.contains(event->globalPosition().toPoint()))
                break;
            if (state != nullptr)
                break;
            if (qobject_cast<QMainWindow*>(parent) == nullptr && qobject_cast<QDockWidgetGroupWindow*>(parent) == nullptr)
                break;
            if (isAnimating())
                break;
            initDrag(event->position().toPoint(), true);
            if (state == nullptr)
                break;
            state->ctrlDrag = (event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());
            startDrag(DragScope::Group);
            break;
        case QEvent::NonClientAreaMouseMove:
            if (state == nullptr || !state->dragging)
                break;

#if !defined(Q_OS_MAC) && !defined(Q_OS_WASM)
            if (state->nca)
                endDrag(EndDragMode::LocationChange);
#endif
            break;
        case QEvent::NonClientAreaMouseButtonRelease:
#if defined(Q_OS_MAC) || defined(Q_OS_WASM)
                        if (state)
                            endDrag(EndDragMode::LocationChange);
#endif
                        break;
        case QEvent::NonClientAreaMouseButtonDblClick:
            toggleTopLevel();
            break;
        default:
            break;
    }
}